

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_multi_buffer_set_usage
               (ggml_backend_buffer_t buffer,ggml_backend_buffer_usage usage)

{
  void *pvVar1;
  _Bool _Var2;
  ggml_backend_buffer_t in_RDI;
  size_t i;
  ggml_backend_multi_buffer_context *ctx;
  ggml_backend_buffer_usage in_stack_ffffffffffffffdc;
  ggml_backend_buffer_t buffer_00;
  
  _Var2 = ggml_backend_buffer_is_multi_buffer(in_RDI);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0x24d,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_multi_buffer(buffer)");
  }
  pvVar1 = in_RDI->context;
  for (buffer_00 = (ggml_backend_buffer_t)0x0;
      buffer_00 < *(ggml_backend_buffer_t *)((long)pvVar1 + 8);
      buffer_00 = (ggml_backend_buffer_t)((long)&(buffer_00->iface).free_buffer + 1)) {
    ggml_backend_buffer_set_usage(buffer_00,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void ggml_backend_multi_buffer_set_usage(ggml_backend_buffer_t buffer, enum ggml_backend_buffer_usage usage) {
    GGML_ASSERT(ggml_backend_buffer_is_multi_buffer(buffer));
    ggml_backend_multi_buffer_context * ctx = (ggml_backend_multi_buffer_context *) buffer->context;
    for (size_t i = 0; i < ctx->n_buffers; i++) {
        ggml_backend_buffer_set_usage(ctx->buffers[i], usage);
    }
}